

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DateImplementation.cpp
# Opt level: O0

bool Js::DateImplementation::TryParseTwoDecimalDigits
               (char16 *str,size_t length,size_t startIndex,int *value,bool canHaveTrailingDigit)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  bool local_39;
  bool hasNoTrailingDigit;
  short v;
  unsigned_short d;
  bool canHaveTrailingDigit_local;
  int *value_local;
  size_t startIndex_local;
  size_t length_local;
  char16 *str_local;
  
  if (str == (char16 *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/DateImplementation.cpp"
                                ,0x2ee,"(str)","str");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (length == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/DateImplementation.cpp"
                                ,0x2ef,"(length)","length");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (length < startIndex) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/DateImplementation.cpp"
                                ,0x2f0,"(startIndex <= length)","startIndex <= length");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (length - startIndex < 2) {
    str_local._7_1_ = false;
  }
  else if ((ushort)(str[startIndex] + L'￐') < 10) {
    if ((ushort)(str[startIndex + 1] + L'￐') < 10) {
      *value = (int)(short)((str[startIndex] + L'￐') * 10) +
               (uint)(ushort)(str[startIndex + 1] + L'￐');
      bVar2 = false;
      if (2 < length - startIndex) {
        bVar2 = (ushort)(str[startIndex + 2] + L'￐') < 10;
      }
      local_39 = true;
      if (!canHaveTrailingDigit) {
        local_39 = (bool)(bVar2 ^ 1);
      }
      str_local._7_1_ = local_39;
    }
    else {
      str_local._7_1_ = false;
    }
  }
  else {
    str_local._7_1_ = false;
  }
  return str_local._7_1_;
}

Assistant:

bool DateImplementation::TryParseTwoDecimalDigits(
        const char16 *const str,
        const size_t length,
        const size_t startIndex,
        int &value,
        bool canHaveTrailingDigit /* = false */)
    {
        Assert(str);
        Assert(length);
        Assert(startIndex <= length);

        if(length - startIndex < 2)
            return false;

        unsigned short d = str[startIndex] - _u('0');
        if(d > 9)
            return false;
        short v = d * 10;
        d = str[startIndex + 1] - _u('0');
        if(d > 9)
            return false;
        value = v + d;

        // The next character must not be a digit if canHaveTrailingDigit is false
        bool hasNoTrailingDigit = !(length - startIndex > 2 && static_cast<unsigned short>(str[startIndex + 2] - _u('0')) <= 9);
        return canHaveTrailingDigit || hasNoTrailingDigit;
    }